

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

bool __thiscall cmCTestHG::IdentifyParser::ProcessLine(IdentifyParser *this)

{
  bool bVar1;
  string local_40;
  
  bVar1 = cmsys::RegularExpression::find(&this->RegexIdentify,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_40,&(this->RegexIdentify).regmatch,1);
    std::__cxx11::string::operator=((string *)this->Rev,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return !bVar1;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexIdentify.find(this->Line)) {
      this->Rev = this->RegexIdentify.match(1);
      return false;
    }
    return true;
  }